

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O3

int __thiscall pele::physics::turbinflow::TurbInflow::init(TurbInflow *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  ulong uVar1;
  char cVar2;
  uint uVar3;
  int extraout_EAX;
  istream *piVar4;
  istream *piVar5;
  FArrayBox *this_01;
  Arena *ar;
  pointer pTVar6;
  int *ptr;
  long lVar7;
  long lVar8;
  int iVar9;
  int i;
  int iVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  Array<int,_3> npts;
  Vector<double,_std::allocator<double>_> turb_center;
  Array<int,_3> iper;
  string turb_header;
  Array<amrex::Real,_3> probsize;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tp_list;
  string side;
  Real rdummy;
  ParmParse pp;
  ParmParse ppr;
  ifstream is;
  int local_3e0 [4];
  ulong local_3d0;
  vector<double,_std::allocator<double>_> local_3c8;
  int local_3a8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  double local_358 [3];
  long local_340;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  string local_318;
  ulong local_2f8;
  undefined8 local_2f0;
  ParmParse local_2e8;
  ParmParse local_290;
  undefined1 local_238 [24];
  undefined8 auStack_220 [62];
  
  local_238._8_8_ = (ostream *)0x0;
  local_238[0x10] = '\0';
  local_238._0_8_ = local_238 + 0x10;
  amrex::ParmParse::ParmParse(&local_290,(string *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
  }
  uVar3 = amrex::ParmParse::countval(&local_290,"turbinflows",-1);
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)uVar3) {
    local_3d0 = CONCAT44(local_3d0._4_4_,uVar3);
    uVar11 = (ulong)uVar3;
    std::
    vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
    ::resize((vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
              *)this,uVar11);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_338,uVar11);
    lVar7 = 0;
    iVar9 = 0;
    local_2f8 = uVar11;
    do {
      amrex::ParmParse::get
                (&local_290,"turbinflows",
                 (string *)
                 ((long)&((local_338.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7),
                 iVar9);
      iVar9 = iVar9 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar11 << 5 != lVar7);
    if (0 < (int)local_3d0) {
      local_340 = 0x60;
      uVar11 = 0;
      do {
        local_3d0 = uVar11;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,"turbinflow.",
                       local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar11);
        amrex::ParmParse::ParmParse(&local_2e8,(string *)local_238);
        if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
          operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
        }
        iVar9 = amrex::ParmParse::countval(&local_2e8,"turb_file",-1);
        uVar1 = local_3d0;
        if (0 < iVar9) {
          amrex::ParmParse::query
                    (&local_2e8,"turb_file",
                     &(this->tp).
                      super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                      .
                      super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_3d0].m_turb_file,0);
          ptr = (int *)((long)((this->tp).
                               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               .
                               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar1) + 0x90);
          *ptr = -1;
          amrex::ParmParse::query(&local_2e8,"dir",ptr,0);
          local_318._M_string_length = 0;
          local_318.field_2._M_local_buf[0] = '\0';
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          amrex::ParmParse::query(&local_2e8,"side",&local_318,0);
          iVar9 = std::__cxx11::string::compare((char *)&local_318);
          if (iVar9 == 0) {
            pTVar6 = (this->tp).
                     super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                     .
                     super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(Side *)((long)(pTVar6 + uVar1) + 0x94) = low;
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_318);
            if (iVar9 == 0) {
              pTVar6 = (this->tp).
                       super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       .
                       super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(Side *)((long)(pTVar6 + uVar1) + 0x94) = high;
            }
            else {
              amrex::Abort_host("turbinflow.side can only be low or high");
              pTVar6 = (this->tp).
                       super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       .
                       super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
          }
          amrex::ParmParse::query
                    (&local_2e8,"time_offset",(Real *)((long)(pTVar6 + uVar1) + 0x98),0);
          amrex::ParmParse::query
                    (&local_2e8,"turb_scale_loc",
                     (Real *)((long)((this->tp).
                                     super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                     .
                                     super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar1) + 200),0);
          amrex::ParmParse::query
                    (&local_2e8,"turb_scale_vel",
                     (Real *)((long)((this->tp).
                                     super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                     .
                                     super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar1) + 0xd0),0);
          local_238._8_8_ = amrex::OutStream();
          this_00 = (ostringstream *)(local_238 + 0x10);
          local_238._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
          local_238._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
          std::__cxx11::ostringstream::ostringstream(this_00);
          *(undefined8 *)
           ((long)auStack_220 + *(long *)(CONCAT71(local_238._17_7_,local_238[0x10]) + -0x18)) =
               *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Initializing turbInflow ",0x18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,
                     local_338.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                     local_338.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," with file ",0xb);
          pTVar6 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,*(char **)&pTVar6[uVar1].m_turb_file,
                     *(size_type *)((long)(pTVar6 + uVar1) + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," (location coordinates in will be scaled by ",0x2c);
          std::ostream::_M_insert<double>
                    (*(Real *)((long)((this->tp).
                                      super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                      .
                                      super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar1) + 200));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," and velocity out to be scaled by ",0x22);
          std::ostream::_M_insert<double>
                    (*(Real *)((long)((this->tp).
                                      super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                      .
                                      super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar1) + 0xd0));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") \n",3);
          amrex::Print::~Print((Print *)local_238);
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 2;
          *local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start = 0.0;
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 0.0;
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          amrex::ParmParse::getarr(&local_2e8,"turb_center",&local_3c8,0,-1);
          lVar7 = (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
          pTVar6 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (0 < lVar7) {
            lVar8 = 0;
            do {
              local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] =
                   *(Real *)((long)(pTVar6 + uVar1) + 200) *
                   local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar7 != lVar8);
          }
          amrex::ParmParse::query(&local_2e8,"turb_nplane",(int *)((long)(pTVar6 + uVar1) + 0xa0),0)
          ;
          amrex::ParmParse::query
                    (&local_2e8,"turb_conv_vel",
                     (Real *)((long)((this->tp).
                                     super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                     .
                                     super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar1) + 0xd8),0);
          pTVar6 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          lVar7 = *(long *)&pTVar6[uVar1].m_turb_file;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_378,lVar7,*(size_type *)((long)(pTVar6 + uVar1) + 8) + lVar7);
          std::__cxx11::string::append((char *)&local_378);
          std::ifstream::ifstream((Print *)local_238,local_378._M_dataplus._M_p,_S_in);
          cVar2 = std::__basic_file<char>::is_open();
          if (cVar2 == '\0') {
            std::operator+(&local_398,"Unable to open input file ",&local_378);
            amrex::Abort(&local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,
                              CONCAT44(local_398.field_2._M_allocated_capacity._4_4_,
                                       local_398.field_2._M_allocated_capacity._0_4_) + 1);
            }
          }
          local_3e0[2] = 0;
          local_3e0[0] = 0;
          local_3e0[1] = 0;
          local_358[2] = 0.0;
          local_358[0] = 0.0;
          local_358[1] = 0.0;
          local_3a8[2] = 0;
          local_3a8[0] = 0;
          local_3a8[1] = 0;
          piVar4 = (istream *)std::istream::operator>>((istream *)local_238,local_3e0);
          piVar4 = (istream *)std::istream::operator>>(piVar4,local_3e0 + 1);
          std::istream::operator>>(piVar4,local_3e0 + 2);
          piVar5 = std::istream::_M_extract<double>((double *)local_238);
          piVar5 = std::istream::_M_extract<double>((double *)piVar5);
          std::istream::_M_extract<double>((double *)piVar5);
          piVar4 = (istream *)std::istream::operator>>((istream *)local_238,local_3a8);
          piVar4 = (istream *)std::istream::operator>>(piVar4,local_3a8 + 1);
          std::istream::operator>>(piVar4,local_3a8 + 2);
          pTVar6 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = 0;
          do {
            dVar12 = local_358[lVar7] / (double)(local_3e0[lVar7] + -1);
            *(double *)((long)&pTVar6->npboxcells + lVar7 * 8 + local_340 + 0xffffffffffffffc8U) =
                 dVar12;
            *(double *)((long)&pTVar6->npboxcells + lVar7 * 8 + local_340 + 0xffffffffffffffe0U) =
                 1.0 / dVar12;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          dVar12 = ((GpuArray<double,_3U> *)((long)(pTVar6 + uVar1) + 0x48))->arr[0];
          dVar13 = *(double *)((long)(pTVar6 + uVar1) + 0x50);
          dVar12 = local_358[0] - (dVar12 + dVar12);
          ((GpuArray<double,_3U> *)((long)(pTVar6 + uVar1) + 0x78))->arr[0] = dVar12;
          dVar13 = local_358[1] - (dVar13 + dVar13);
          *(double *)((long)(pTVar6 + uVar1) + 0x80) = dVar13;
          *(double *)((long)(pTVar6 + uVar1) + 0x88) = local_358[2];
          ((GpuArray<int,_3U> *)((long)(pTVar6 + uVar1) + 0x20))->arr[0] = local_3e0[0] + -3;
          *(int *)((long)(pTVar6 + uVar1) + 0x24) = local_3e0[1] + -3;
          *(int *)((long)(pTVar6 + uVar1) + 0x28) = local_3e0[2];
          ((GpuArray<double,_3U> *)((long)(pTVar6 + uVar1) + 0x30))->arr[0] =
               dVar12 * -0.5 +
               *local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
          *(double *)((long)(pTVar6 + uVar1) + 0x38) =
               dVar13 * -0.5 +
               local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1];
          *(double *)((long)(pTVar6 + uVar1) + 0x40) = 0.0;
          local_398.field_2._M_allocated_capacity._4_4_ = *(int *)((long)(pTVar6 + uVar1) + 0xa0);
          local_398._M_dataplus._M_p = (pointer)0x100000001;
          local_398._M_string_length._0_4_ = 1;
          local_398.field_2._8_4_ = 0;
          local_398._M_string_length._4_4_ = local_3e0[0];
          local_398.field_2._M_allocated_capacity._0_4_ = local_3e0[1];
          this_01 = (FArrayBox *)operator_new(0x48);
          ar = amrex::The_Async_Arena();
          amrex::FArrayBox::FArrayBox(this_01,(Box *)&local_398,3,ar);
          pTVar6 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(FArrayBox **)((long)(pTVar6 + uVar1) + 0xa8) = this_01;
          *(int *)((long)(pTVar6 + uVar1) + 0xf8) = local_3e0[2];
          iVar9 = local_3e0[2];
          if ((0 < local_3e0[2] & *(bool *)((long)(pTVar6 + uVar1) + 0xc0)) == 1) {
            iVar10 = 0;
            do {
              local_2f0 = 0;
              std::istream::_M_extract<double>((double *)local_238);
              iVar10 = iVar10 + 1;
              pTVar6 = (this->tp).
                       super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       .
                       super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar9 = *(int *)((long)(pTVar6 + uVar1) + 0xf8);
            } while (iVar10 < iVar9);
          }
          std::vector<long,_std::allocator<long>_>::resize
                    ((vector<long,_std::allocator<long>_> *)((long)(pTVar6 + uVar1) + 0xe0),
                     (long)(iVar9 * 3));
          pTVar6 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(long **)((long)(pTVar6 + uVar1) + 0x100) = *(long **)((long)(pTVar6 + uVar1) + 0xe0);
          lVar7 = (long)*(pointer *)((long)(pTVar6 + uVar1) + 0xe8) -
                  (long)*(long **)((long)(pTVar6 + uVar1) + 0xe0) >> 3;
          *(long *)((long)(pTVar6 + uVar1) + 0x108) = lVar7;
          if (0 < lVar7) {
            lVar7 = 0;
            do {
              std::istream::_M_extract<long>((long *)local_238);
              lVar7 = lVar7 + 1;
            } while (lVar7 < *(long *)((long)((this->tp).
                                              super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                              .
                                              super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar1) +
                                      0x108));
          }
          std::ifstream::close();
          std::ifstream::~ifstream((Print *)local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (double *)0x0) {
            operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,
                            CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                     local_318.field_2._M_local_buf[0]) + 1);
          }
        }
        this->turbinflow_initialized = true;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2e8);
        uVar11 = local_3d0 + 1;
        local_340 = local_340 + 0x110;
      } while (uVar11 != local_2f8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_290);
  return extraout_EAX;
}

Assistant:

void
TurbInflow::init(amrex::Geometry const& /*geom*/)
{
  amrex::ParmParse ppr;

  int n_tp = 0;
  n_tp = ppr.countval("turbinflows");
  amrex::Vector<std::string> tp_list;
  if (n_tp > 0) {
    tp.resize(n_tp);
    tp_list.resize(n_tp);
    for (int n = 0; n < n_tp; n++) {
      ppr.get("turbinflows", tp_list[n], n);
    }
  }

  for (int n = 0; n < n_tp; n++) {

    amrex::ParmParse pp("turbinflow." + tp_list[n]);
    if (pp.countval("turb_file") > 0) {

      // Query data
      pp.query("turb_file", tp[n].m_turb_file);
      tp[n].dir = -1;
      pp.query("dir", tp[n].dir);
      AMREX_ASSERT_WITH_MESSAGE(
        tp[n].dir >= 0 && tp[n].dir < AMREX_SPACEDIM,
        "Injection direction is needed: 0, 1 or 2");
      std::string side;
      pp.query("side", side);
      if (side == "low") {
        tp[n].side = amrex::Orientation::low;
      } else if (side == "high") {
        tp[n].side = amrex::Orientation::high;
      } else {
        amrex::Abort("turbinflow.side can only be low or high");
      }
      pp.query("time_offset", tp[n].time_shift);
      pp.query("turb_scale_loc", tp[n].turb_scale_loc);
      pp.query("turb_scale_vel", tp[n].turb_scale_vel);
      amrex::Print() << "Initializing turbInflow " << tp_list[n]
                     << " with file " << tp[n].m_turb_file
                     << " (location coordinates in will be scaled by "
                     << tp[n].turb_scale_loc
                     << " and velocity out to be scaled by "
                     << tp[n].turb_scale_vel << ") \n";

      // Get the turbcenter on the injection face
      amrex::Vector<amrex::Real> turb_center(AMREX_SPACEDIM - 1, 0);
      pp.getarr("turb_center", turb_center);
      AMREX_ASSERT_WITH_MESSAGE(
        turb_center.size() == AMREX_SPACEDIM - 1,
        "turb_center must have AMREX_SPACEDIM-1 elements");
      for (int idim = 0; idim < turb_center.size(); ++idim) {
        turb_center[idim] *= tp[n].turb_scale_loc;
      }

      pp.query("turb_nplane", tp[n].nplane);
      AMREX_ASSERT(tp[n].nplane > 0);
      pp.query("turb_conv_vel", tp[n].turb_conv_vel);
      AMREX_ASSERT(tp[n].turb_conv_vel > 0);

      // Set other stuff
      std::string turb_header = tp[n].m_turb_file + "/HDR";
      std::ifstream is(turb_header.c_str());
      if (!is.is_open()) {
        amrex::Abort("Unable to open input file " + turb_header);
      }
      amrex::Array<int, AMREX_SPACEDIM> npts = {{0}};
      amrex::Array<amrex::Real, AMREX_SPACEDIM> probsize = {{0}};
      amrex::Array<int, AMREX_SPACEDIM> iper = {{0}};
      is >> npts[0] >> npts[1] >> npts[2];
      is >> probsize[0] >> probsize[1] >> probsize[2];
      is >> iper[0] >> iper[1] >>
        iper[2]; // Unused - we assume it is always fully periodic

      for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        tp[n].dx[idim] = probsize[idim] / amrex::Real(npts[idim] - 1);
        tp[n].dxinv[idim] = 1.0 / tp[n].dx[idim];
      }

      // The following is relative to the injection face:
      // 0 and 1 are transverse directions, 2 is normal
      // one ghost point on each side, tangential to inflow face
      tp[n].pboxsize[0] = probsize[0] - 2.0 * tp[n].dx[0];
      tp[n].pboxsize[1] = probsize[1] - 2.0 * tp[n].dx[1];
      tp[n].pboxsize[2] = probsize[2];

      tp[n].npboxcells[0] = npts[0] - 3;
      tp[n].npboxcells[1] = npts[1] - 3;
      tp[n].npboxcells[2] = npts[2];

      // Center the turbulence
      tp[n].pboxlo[0] = turb_center[0] - 0.5 * tp[n].pboxsize[0];
      tp[n].pboxlo[1] = turb_center[1] - 0.5 * tp[n].pboxsize[1];
      tp[n].pboxlo[2] = 0.;

      amrex::Box sbx(
        amrex::IntVect(AMREX_D_DECL(1, 1, 1)),
        amrex::IntVect(AMREX_D_DECL(npts[0], npts[1], tp[n].nplane)));

      tp[n].sdata = new amrex::FArrayBox(sbx, 3, amrex::The_Async_Arena());

      tp[n].kmax = npts[2];

      if (tp[n].isswirltype) {
        for (int i = 0; i < tp[n].kmax; i++) {
          amrex::Real rdummy = 0.0;
          is >> rdummy; // Time for each plane - unused at the moment
        }
      }

      // Offset for each plane in Binary TurbFile
      tp[n].m_offset.resize(tp[n].kmax * AMREX_SPACEDIM);
      tp[n].offset = tp[n].m_offset.data();
      tp[n].offset_size = tp[n].m_offset.size();
      for (int i = 0; i < tp[n].offset_size; i++) {
        is >> tp[n].offset[i];
      }
      is.close();
    }
    turbinflow_initialized = true;
  }
}